

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchroniser.cpp
# Opt level: O0

void __thiscall
Synchroniser::decideWhichAndHowMuchInEach2extractFromSender
          (Synchroniser *this,wallet *sendersWallet,linkedList<myString> *btcId2extract_list,
          linkedList<int> *amountInEachBtc2extract_list,int amount2extract,
          linkedList<myString> *indexesList2remove)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  myString *pmVar5;
  linkedList<int> local_180;
  undefined1 local_160 [48];
  undefined1 local_130 [40];
  myString local_108;
  myString local_f0;
  int local_d4;
  undefined1 local_d0 [4];
  int index;
  undefined1 local_c0 [64];
  linkedList<myString> local_80;
  undefined1 local_60 [8];
  Iterator ItB;
  Iterator ItA;
  int amountRemain2gather;
  linkedList<myString> *indexesList2remove_local;
  int amount2extract_local;
  linkedList<int> *amountInEachBtc2extract_list_local;
  linkedList<myString> *btcId2extract_list_local;
  wallet *sendersWallet_local;
  Synchroniser *this_local;
  
  linkedList<myString>::Iterator::Iterator((Iterator *)&ItB.currPtr);
  linkedList<int>::Iterator::Iterator((Iterator *)local_60);
  wallet::getBtcIdsOwned_list(&local_80,sendersWallet);
  iVar2 = linkedList<myString>::getSize(&local_80);
  wallet::getAmountOnEachBtc((linkedList<int> *)(local_c0 + 0x10),sendersWallet);
  iVar3 = linkedList<int>::getSize((linkedList<int> *)(local_c0 + 0x10));
  if (iVar2 != iVar3) {
    __assert_fail("sendersWallet->getBtcIdsOwned_list().getSize() == sendersWallet->getAmountOnEachBtc().getSize()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DimitrisGan[P]transactionBitCoinSystem/synchroniser.cpp"
                  ,0x5b,
                  "void Synchroniser::decideWhichAndHowMuchInEach2extractFromSender(wallet *, linkedList<myString> &, linkedList<int> &, int, linkedList<myString> &)"
                 );
  }
  linkedList<int>::~linkedList((linkedList<int> *)(local_c0 + 0x10));
  linkedList<myString>::~linkedList(&local_80);
  wallet::getBtcIdsOwned_listByRef(sendersWallet);
  linkedList<myString>::begin((linkedList<myString> *)local_c0);
  linkedList<myString>::Iterator::operator=((Iterator *)&ItB.currPtr,(Iterator *)local_c0);
  linkedList<myString>::Iterator::~Iterator((Iterator *)local_c0);
  wallet::getAmountOnEachBtcByRef(sendersWallet);
  linkedList<int>::begin((linkedList<int> *)local_d0);
  linkedList<int>::Iterator::operator=((Iterator *)local_60,(Iterator *)local_d0);
  linkedList<int>::Iterator::~Iterator((Iterator *)local_d0);
  local_d4 = 0;
  ItA.currPtr._4_4_ = amount2extract;
  while (piVar4 = linkedList<int>::Iterator::operator*((Iterator *)local_60),
        *piVar4 < ItA.currPtr._4_4_) {
    piVar4 = linkedList<int>::Iterator::operator*((Iterator *)local_60);
    ItA.currPtr._4_4_ = ItA.currPtr._4_4_ - *piVar4;
    pmVar5 = linkedList<myString>::Iterator::operator*((Iterator *)&ItB.currPtr);
    myString::myString(&local_108,pmVar5);
    linkedList<myString>::insert_last(btcId2extract_list,&local_108);
    myString::~myString(&local_108);
    piVar4 = linkedList<int>::Iterator::operator*((Iterator *)local_60);
    linkedList<int>::insert_last(amountInEachBtc2extract_list,*piVar4);
    iVar2 = wallet::getBalance(sendersWallet);
    piVar4 = linkedList<int>::Iterator::operator*((Iterator *)local_60);
    wallet::setBalance(sendersWallet,iVar2 - *piVar4);
    pmVar5 = linkedList<myString>::Iterator::operator*((Iterator *)&ItB.currPtr);
    myString::myString((myString *)(local_130 + 0x10),pmVar5);
    linkedList<myString>::insert_last(indexesList2remove,(myString *)(local_130 + 0x10));
    myString::~myString((myString *)(local_130 + 0x10));
    piVar4 = linkedList<int>::Iterator::operator*((Iterator *)local_60);
    *piVar4 = 0;
    local_d4 = local_d4 + 1;
    wallet::getBtcIdsOwned_list((linkedList<myString> *)(local_160 + 0x10),sendersWallet);
    linkedList<myString>::end((linkedList<myString> *)local_130);
    bVar1 = linkedList<myString>::Iterator::operator!=
                      ((Iterator *)&ItB.currPtr,(Iterator *)local_130);
    linkedList<myString>::Iterator::~Iterator((Iterator *)local_130);
    linkedList<myString>::~linkedList((linkedList<myString> *)(local_160 + 0x10));
    if (bVar1) {
      linkedList<myString>::Iterator::operator++((Iterator *)&ItB.currPtr);
    }
    wallet::getAmountOnEachBtc(&local_180,sendersWallet);
    linkedList<int>::end((linkedList<int> *)local_160);
    bVar1 = linkedList<int>::Iterator::operator!=((Iterator *)local_60,(Iterator *)local_160);
    linkedList<int>::Iterator::~Iterator((Iterator *)local_160);
    linkedList<int>::~linkedList(&local_180);
    if (bVar1) {
      linkedList<int>::Iterator::operator++((Iterator *)local_60);
    }
  }
  pmVar5 = linkedList<myString>::Iterator::operator*((Iterator *)&ItB.currPtr);
  myString::myString(&local_f0,pmVar5);
  linkedList<myString>::insert_last(btcId2extract_list,&local_f0);
  myString::~myString(&local_f0);
  linkedList<int>::insert_last(amountInEachBtc2extract_list,ItA.currPtr._4_4_);
  piVar4 = linkedList<int>::Iterator::operator*((Iterator *)local_60);
  iVar2 = *piVar4;
  piVar4 = linkedList<int>::Iterator::operator*((Iterator *)local_60);
  *piVar4 = iVar2 - ItA.currPtr._4_4_;
  iVar2 = wallet::getBalance(sendersWallet);
  wallet::setBalance(sendersWallet,iVar2 - ItA.currPtr._4_4_);
  linkedList<int>::Iterator::~Iterator((Iterator *)local_60);
  linkedList<myString>::Iterator::~Iterator((Iterator *)&ItB.currPtr);
  return;
}

Assistant:

void Synchroniser::decideWhichAndHowMuchInEach2extractFromSender(wallet *sendersWallet,
                                                                 linkedList<myString> &btcId2extract_list,
                                                                 linkedList<int> &amountInEachBtc2extract_list,
                                                                 int amount2extract,
                                                                 linkedList<myString> &indexesList2remove) {

    int amountRemain2gather =amount2extract;

    linkedList<myString>::Iterator  ItA;
    linkedList<int>::Iterator  ItB;

    assert(sendersWallet->getBtcIdsOwned_list().getSize() == sendersWallet->getAmountOnEachBtc().getSize());



    ItA = sendersWallet->getBtcIdsOwned_listByRef().begin();
    ItB = sendersWallet->getAmountOnEachBtcByRef().begin();
    /*
     * ItA = btcId name
     * ItB = amount owned of the current btc
     **/
    int index =0; //maybe is needed to deleteByIndex if a btc to senders wallet reached zero
    while(true) //iterate simultaneously the 2 lists
    {

        //do stuff with ItA and ItB

        if (*ItB >= amountRemain2gather){ //means that the percentage amount of this btc is bigger than the remain2extract
            btcId2extract_list.insert_last(*ItA);
            amountInEachBtc2extract_list.insert_last(amountRemain2gather);

            *ItB = *ItB - amountRemain2gather; //reduce the amount from the owner(=sender) wallet
            sendersWallet->setBalance(sendersWallet->getBalance() - amountRemain2gather); //update the new total baalnce
            amountRemain2gather=0;

            break;

        }
        else { //means that the wallet will give all his onwership to this btc
            amountRemain2gather -= *ItB;

            btcId2extract_list.insert_last(*ItA); //add btcId in exchange list
            amountInEachBtc2extract_list.insert_last(*ItB);
            sendersWallet->setBalance(sendersWallet->getBalance() - *ItB); //update the new total baalnce

            indexesList2remove.insert_last(*ItA);
            *ItB = 0; //the wallet(=sender) is not owner of this btc anymore

        }


        index++;

        if(ItA != sendersWallet->getBtcIdsOwned_list().end())
        {
            ++ItA;
        }
        if(ItB != sendersWallet->getAmountOnEachBtc().end())
        {
            ++ItB;
        }
//        if(ItA == sendersWallet->getBtcIdsOwned_list().end() && ItB == sendersWallet->getAmountOnEachBtc().end())
//        {
//            break;
//        }
    }
}